

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cxx
# Opt level: O2

bool zmq_send(socket_t *socket,string *s)

{
  void *__dest;
  ssize_t sVar1;
  size_t in_RCX;
  int in_R8D;
  message_t msg;
  message_t mStack_58;
  
  zmq::message_t::message_t(&mStack_58,s->_M_string_length);
  __dest = zmq::message_t::data(&mStack_58);
  memcpy(__dest,(s->_M_dataplus)._M_p,s->_M_string_length);
  sVar1 = zmq::detail::socket_base::send
                    (&socket->super_socket_base,(int)&mStack_58,(void *)0x0,in_RCX,in_R8D);
  zmq::message_t::~message_t(&mStack_58);
  return (bool)(char)sVar1;
}

Assistant:

bool zmq_send(zmq::socket_t &socket, const std::string &s) {
    zmq::message_t msg(s.size());
    memcpy(msg.data(), s.data(), s.size());

    return socket.send(msg);
}